

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Render(void)

{
  bool bVar1;
  ImGuiWindow **ppIVar2;
  int n_1;
  ImGuiWindow *window;
  int n;
  ImGuiWindow *windows_to_render_front_most [2];
  ImGuiContext *g;
  ImGuiMouseCursor in_stack_00000160;
  float in_stack_00000164;
  ImDrawList *in_stack_00000168;
  ImVec2 in_stack_00000170;
  ImGuiWindow *draw_list;
  ImDrawDataBuilder *in_stack_ffffffffffffffc0;
  ImGuiWindow *window_00;
  int local_2c;
  ImGuiWindow *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int i;
  ImGuiWindow *local_18 [2];
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    EndFrame();
  }
  local_8->FrameCountRendered = local_8->FrameCount;
  (local_8->IO).MetricsRenderWindows = 0;
  (local_8->IO).MetricsRenderIndices = 0;
  (local_8->IO).MetricsRenderVertices = 0;
  ImDrawDataBuilder::Clear(in_stack_ffffffffffffffc0);
  if ((local_8->NavWindowingTarget == (ImGuiWindow *)0x0) ||
     ((local_8->NavWindowingTarget->Flags & 0x2000U) != 0)) {
    window_00 = (ImGuiWindow *)0x0;
  }
  else {
    window_00 = local_8->NavWindowingTarget->RootWindow;
  }
  local_18[0] = window_00;
  if (local_8->NavWindowingTarget == (ImGuiWindow *)0x0) {
    draw_list = (ImGuiWindow *)0x0;
  }
  else {
    draw_list = local_8->NavWindowingList;
  }
  local_18[1] = draw_list;
  for (i = 0; i != (local_8->Windows).Size; i = i + 1) {
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&local_8->Windows,i);
    in_stack_ffffffffffffffd8 = *ppIVar2;
    bVar1 = IsWindowActiveAndVisible(in_stack_ffffffffffffffd8);
    if ((((bVar1) && ((in_stack_ffffffffffffffd8->Flags & 0x1000000U) == 0)) &&
        (in_stack_ffffffffffffffd8 != local_18[0])) && (in_stack_ffffffffffffffd8 != local_18[1])) {
      AddWindowToDrawDataSelectLayer(window_00);
    }
  }
  for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
    if ((local_18[local_2c] != (ImGuiWindow *)0x0) &&
       (bVar1 = IsWindowActiveAndVisible(local_18[local_2c]), bVar1)) {
      AddWindowToDrawDataSelectLayer(window_00);
    }
  }
  ImDrawDataBuilder::FlattenIntoSingleLayer
            ((ImDrawDataBuilder *)CONCAT44(i,in_stack_ffffffffffffffe0));
  if (((local_8->IO).MouseDrawCursor & 1U) != 0) {
    RenderMouseCursor(in_stack_00000168,in_stack_00000170,in_stack_00000164,in_stack_00000160);
  }
  bVar1 = ImVector<ImDrawVert>::empty(&(local_8->OverlayDrawList).VtxBuffer);
  if (!bVar1) {
    AddDrawListToDrawData((ImVector<ImDrawList_*> *)window_00,(ImDrawList *)draw_list);
  }
  SetupDrawData((ImVector<ImDrawList_*> *)CONCAT44(i,in_stack_ffffffffffffffe0),
                (ImDrawData *)in_stack_ffffffffffffffd8);
  (local_8->IO).MetricsRenderVertices = (local_8->DrawData).TotalVtxCount;
  (local_8->IO).MetricsRenderIndices = (local_8->DrawData).TotalIdxCount;
  if ((0 < (local_8->DrawData).CmdListsCount) &&
     ((local_8->IO).RenderDrawListsFn != (_func_void_ImDrawData_ptr *)0x0)) {
    (*(local_8->IO).RenderDrawListsFn)(&local_8->DrawData);
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;

    // Gather ImDrawList to render (for each active window)
    g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = g.IO.MetricsRenderWindows = 0;
    g.DrawDataBuilder.Clear();
    ImGuiWindow* windows_to_render_front_most[2];
    windows_to_render_front_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_front_most[1] = g.NavWindowingTarget ? g.NavWindowingList : NULL;
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_front_most[0] && window != windows_to_render_front_most[1])
            AddWindowToDrawDataSelectLayer(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_front_most); n++)
        if (windows_to_render_front_most[n] && IsWindowActiveAndVisible(windows_to_render_front_most[n])) // NavWindowingTarget is always temporarily displayed as the front-most window
            AddWindowToDrawDataSelectLayer(windows_to_render_front_most[n]);
    g.DrawDataBuilder.FlattenIntoSingleLayer();

    // Draw software mouse cursor if requested
    if (g.IO.MouseDrawCursor)
        RenderMouseCursor(&g.OverlayDrawList, g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor);

    if (!g.OverlayDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.OverlayDrawList);

    // Setup ImDrawData structure for end-user
    SetupDrawData(&g.DrawDataBuilder.Layers[0], &g.DrawData);
    g.IO.MetricsRenderVertices = g.DrawData.TotalVtxCount;
    g.IO.MetricsRenderIndices = g.DrawData.TotalIdxCount;

    // (Legacy) Call the Render callback function. The current prefer way is to let the user retrieve GetDrawData() and call the render function themselves.
#ifndef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
    if (g.DrawData.CmdListsCount > 0 && g.IO.RenderDrawListsFn != NULL)
        g.IO.RenderDrawListsFn(&g.DrawData);
#endif
}